

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O1

void __thiscall xmrig::CudaConfig::setDevicesHint(CudaConfig *this,char *devicesHint)

{
  iterator __position;
  ulong uVar1;
  String *index;
  pointer pSVar2;
  vector<xmrig::String,_std::allocator<xmrig::String>_> indexes;
  String local_50;
  vector<xmrig::String,_std::allocator<xmrig::String>_> local_40;
  
  if (devicesHint != (char *)0x0) {
    String::String(&local_50,devicesHint);
    String::split(&local_40,&local_50,',');
    if ((void *)CONCAT44(local_50.m_data._4_4_,(uint)local_50.m_data) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(local_50.m_data._4_4_,(uint)local_50.m_data));
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_devicesHint,
               (long)local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4);
    if (local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar2 = local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar1 = strtoul(pSVar2->m_data,(char **)0x0,10);
        local_50.m_data._0_4_ = (uint)uVar1;
        __position._M_current =
             (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->m_devicesHint,__position,(uint *)&local_50);
        }
        else {
          *__position._M_current = (uint)local_50.m_data;
          (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pSVar2 = pSVar2 + 1;
      } while (pSVar2 != local_40.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<xmrig::String,_std::allocator<xmrig::String>_>::~vector(&local_40);
  }
  return;
}

Assistant:

void xmrig::CudaConfig::setDevicesHint(const char *devicesHint)
{
    if (devicesHint == nullptr) {
        return;
    }

    const auto indexes = String(devicesHint).split(',');
    m_devicesHint.reserve(indexes.size());

    for (const auto &index : indexes) {
        m_devicesHint.push_back(strtoul(index, nullptr, 10));
    }
}